

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintFreeFieldNumbers
          (CommandLineInterface *this,Descriptor *descriptor)

{
  int iVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  ExtensionRange *pEVar4;
  ReservedRange *pRVar5;
  ReservedRange *pRVar6;
  reference ppVar7;
  ostream *poVar8;
  int i;
  int iVar9;
  size_t i_4;
  ulong uVar10;
  const_iterator cVar11;
  int next_free_number;
  string output;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  nested_messages;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ranges;
  int local_d4;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  int local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  FormatSpec<int> local_98;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_88;
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_78;
  btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  local_60;
  CommandLineInterface *local_48;
  const_iterator local_40;
  
  local_60.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_60.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
             ::EmptyNode()::empty_node;
  local_60.size_ = 0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = this;
  for (iVar9 = 0; iVar9 < descriptor->field_count_; iVar9 = iVar9 + 1) {
    pFVar3 = Descriptor::field(descriptor,iVar9);
    local_d0._M_len = CONCAT44(pFVar3->number_ + 1,pFVar3->number_);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)&local_b8,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)&local_60,(value_type *)&local_d0);
  }
  for (iVar9 = 0; iVar9 < descriptor->extension_range_count_; iVar9 = iVar9 + 1) {
    pEVar4 = Descriptor::extension_range(descriptor,iVar9);
    iVar1 = pEVar4->start_;
    pEVar4 = Descriptor::extension_range(descriptor,iVar9);
    local_d0._M_len = CONCAT44(pEVar4->end_,iVar1);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)&local_b8,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)&local_60,(value_type *)&local_d0);
  }
  for (iVar9 = 0; iVar9 < descriptor->reserved_range_count_; iVar9 = iVar9 + 1) {
    pRVar5 = Descriptor::reserved_range(descriptor,iVar9);
    pRVar6 = Descriptor::reserved_range(descriptor,iVar9);
    local_d0._M_len = CONCAT44(pRVar6->end,pRVar5->start);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)&local_b8,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)&local_60,(value_type *)&local_d0);
  }
  for (iVar9 = 0; iVar9 < descriptor->nested_type_count_; iVar9 = iVar9 + 1) {
    local_b8._M_dataplus._M_p = (pointer)Descriptor::nested_type(descriptor,iVar9);
    std::
    vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)&local_78,(value_type *)&local_b8);
  }
  for (uVar10 = 0;
      uVar10 < (ulong)((long)local_78._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar10 = uVar10 + 1) {
    PrintFreeFieldNumbers(local_48,local_78._M_impl.super__Vector_impl_data._M_start[uVar10]);
  }
  local_d0._M_str = (descriptor->all_names_).payload_;
  local_d0._M_len = (size_t)*(ushort *)(local_d0._M_str + 2);
  local_d0._M_str = local_d0._M_str + ~local_d0._M_len;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_88.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        *)0x35a22b;
  local_88.position_ = 0xb;
  local_88._12_4_ = 0;
  absl::lts_20250127::StrAppendFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
            (&local_b8,(FormatSpec<std::basic_string_view<char>_> *)&local_88,&local_d0);
  local_d4 = 1;
  cVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           ::begin(&local_60);
  local_88.node_ = cVar11.node_;
  local_88.position_ = cVar11.position_;
  cVar11 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           ::end(&local_60);
  local_40.node_ = cVar11.node_;
  local_40.position_ = cVar11.position_;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::
            btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
            ::operator!=(&local_88,&local_40);
    if (!bVar2) break;
    ppVar7 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
             ::operator*(&local_88);
    if (local_d4 < ppVar7->second) {
      iVar9 = ppVar7->first;
      if (local_d4 < iVar9) {
        if (local_d4 + 1 == iVar9) {
          local_98.super_type.spec_.data_ = " %d";
          local_98.super_type.spec_.size_ = 3;
          absl::lts_20250127::StrAppendFormat<int>(&local_b8,&local_98,&local_d4);
        }
        else {
          local_98.super_type.spec_.data_ = " %d-%d";
          local_98.super_type.spec_.size_ = 6;
          local_bc = iVar9 + -1;
          absl::lts_20250127::StrAppendFormat<int,_int>
                    (&local_b8,(FormatSpec<int,_int> *)&local_98,&local_d4,&local_bc);
        }
      }
      local_d4 = ppVar7->second;
    }
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
    ::increment(&local_88);
  }
  if (local_d4 < 0x20000000) {
    local_88.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          *)0x35a23e;
    local_88.position_ = 7;
    local_88._12_4_ = 0;
    absl::lts_20250127::StrAppendFormat<int>(&local_b8,(FormatSpec<int> *)&local_88,&local_d4);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_b8);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Vector_base(&local_78);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  ::~btree(&local_60);
  return;
}

Assistant:

void CommandLineInterface::PrintFreeFieldNumbers(const Descriptor* descriptor) {
  absl::btree_set<FieldRange> ranges;
  std::vector<const Descriptor*> nested_messages;
  GatherOccupiedFieldRanges(descriptor, &ranges, &nested_messages);

  for (size_t i = 0; i < nested_messages.size(); ++i) {
    PrintFreeFieldNumbers(nested_messages[i]);
  }
  FormatFreeFieldNumbers(descriptor->full_name(), ranges);
}